

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxmlstream.cpp
# Opt level: O2

bool isDecoderForEncoding(QStringDecoder *dec,Encoding enc)

{
  bool bVar1;
  long in_FS_OFFSET;
  char *local_40;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 local_38 [2];
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 local_28;
  undefined1 *puStack_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  if ((dec->super_QStringConverter).iface != (Interface *)0x0) {
    local_28.m_data = &DAT_aaaaaaaaaaaaaaaa;
    puStack_20 = &DAT_aaaaaaaaaaaaaaaa;
    local_38[0].m_data_utf8 = QStringConverter::name(&dec->super_QStringConverter);
    QAnyStringView::QAnyStringView<const_char_*,_true>
              ((QAnyStringView *)&local_28,&local_38[0].m_data_utf8);
    if (((ulong)puStack_20 & 0x3fffffffffffffff) != 0) {
      local_40 = QStringConverter::nameForEncoding(enc);
      QAnyStringView::QAnyStringView<const_char_*,_true>((QAnyStringView *)local_38,&local_40);
      bVar1 = comparesEqual((QAnyStringView *)&local_28,(QAnyStringView *)local_38);
      goto LAB_00359074;
    }
  }
  bVar1 = false;
LAB_00359074:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

static bool isDecoderForEncoding(const QStringDecoder &dec, QStringDecoder::Encoding enc)
{
    if (!dec.isValid())
        return false;

    const QAnyStringView nameView{dec.name()};
    return !nameView.empty() && nameView == QStringDecoder::nameForEncoding(enc);
}